

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O1

string * __thiscall
duckdb::DBConfig::UserAgent_abi_cxx11_(string *__return_storage_ptr__,DBConfig *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  GetDefaultUserAgent_abi_cxx11_();
  if ((this->options).duckdb_api._M_string_length != 0) {
    ::std::operator+(&local_30," ",&(this->options).duckdb_api);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  if ((this->options).custom_user_agent._M_string_length != 0) {
    ::std::operator+(&local_30," ",&(this->options).custom_user_agent);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_30._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const string DBConfig::UserAgent() const {
	auto user_agent = GetDefaultUserAgent();

	if (!options.duckdb_api.empty()) {
		user_agent += " " + options.duckdb_api;
	}

	if (!options.custom_user_agent.empty()) {
		user_agent += " " + options.custom_user_agent;
	}
	return user_agent;
}